

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SMBusSimulationDataGenerator::OutputReadByte
          (SMBusSimulationDataGenerator *this,U8 command,U8 data_byte)

{
  byte bVar1;
  U8 byte;
  bool is_ack;
  char cVar2;
  
  OutputStart(this);
  OutputByte(this,0x86,true);
  OutputByte(this,command,true);
  bVar1 = ""[command ^ 0x9b];
  OutputStart(this);
  OutputByte(this,0x87,true);
  is_ack = (bool)AnalyzerSettingInterfaceBool::GetValue();
  OutputByte(this,data_byte,is_ack);
  byte = ""[""[(ulong)bVar1 ^ 0x87] ^ data_byte];
  cVar2 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar2 != '\0') {
    OutputByte(this,byte,false);
  }
  OutputStop(this);
  ClockGenerator::AdvanceByTimeS(0.0005);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputReadByte( U8 command, U8 data_byte )
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( command ) ];
    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, true ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( data_byte, mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}